

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_engine.hpp
# Opt level: O2

AST_NodePtr __thiscall
chaiscript::ChaiScript_Basic::parse(ChaiScript_Basic *this,string *t_input,bool t_debug_print)

{
  undefined8 *puVar1;
  long *plVar2;
  _func_int **pp_Var3;
  char in_CL;
  undefined7 in_register_00000011;
  allocator<char> local_69;
  string local_68 [32];
  string local_48 [32];
  
  puVar1 = (undefined8 *)t_input[9]._M_string_length;
  std::__cxx11::string::string<std::allocator<char>>(local_68,"PARSE",&local_69);
  (**(code **)*puVar1)(this,puVar1,CONCAT71(in_register_00000011,t_debug_print),local_68);
  std::__cxx11::string::~string(local_68);
  if (in_CL != '\0') {
    plVar2 = (long *)t_input[9]._M_string_length;
    pp_Var3 = this->_vptr_ChaiScript_Basic;
    std::__cxx11::string::string<std::allocator<char>>(local_48,"",(allocator<char> *)local_68);
    (**(code **)(*plVar2 + 8))(plVar2,pp_Var3,local_48);
    std::__cxx11::string::~string(local_48);
  }
  return (__uniq_ptr_data<chaiscript::AST_Node,_std::default_delete<chaiscript::AST_Node>,_true,_true>
          )(__uniq_ptr_data<chaiscript::AST_Node,_std::default_delete<chaiscript::AST_Node>,_true,_true>
            )this;
}

Assistant:

AST_NodePtr parse(const std::string &t_input, const bool t_debug_print = false) {
      auto ast = m_parser->parse(t_input, "PARSE");
      if (t_debug_print) {
        m_parser->debug_print(*ast);
      }
      return ast;
    }